

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
IntrusiveListTest_splice_node_Test::TestBody(IntrusiveListTest_splice_node_Test *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  TestObject *pTVar3;
  undefined8 *puVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_03;
  vector<int,_std::allocator<int>_> *expected_04;
  TestObjectList list3;
  TestObjectList list4;
  TestObjectList list1;
  TestObjectList list2;
  uint __flags;
  TestObjectList local_a8;
  TestObjectList local_88;
  TestObjectList local_68;
  TestObjectList local_48;
  
  local_48.size_ = 0;
  local_48.first_ = (TestObject *)0x0;
  local_48.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_48.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_200000001;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 3;
  local_48.first_ = pTVar2;
  local_48.size_ = (size_t)local_48.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList
            (&local_88,(IntrusiveListTest *)&local_48,data_values);
  operator_delete(pTVar2);
  pTVar3 = (TestObject *)operator_new(8);
  (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0xc800000064;
  pTVar2 = pTVar3;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList
            (&local_48,(IntrusiveListTest *)&stack0xffffffffffffff38,data_values_00);
  __flags = (uint)pTVar2;
  operator_delete(pTVar3);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_88,(int)&local_88,(__off64_t *)local_88.first_,(int)&local_48,
             (__off64_t *)&local_48,(size_t)local_48.first_,__flags);
  puVar4 = (undefined8 *)operator_new(0x10);
  *puVar4 = 0x100000064;
  puVar4[1] = 0x300000002;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_88,(TestObjectList *)&stack0xffffffffffffff38,expected);
  operator_delete(puVar4);
  pTVar2 = (TestObject *)operator_new(4);
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = 200
  ;
  pTVar3 = pTVar2;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_48,(TestObjectList *)&stack0xffffffffffffff38,expected_00);
  operator_delete(pTVar2);
  local_a8.size_ = 0;
  local_a8.first_ = (TestObject *)0x0;
  local_a8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0xc);
  local_a8.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ + 4);
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_258000001f4;
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = 700
  ;
  local_a8.first_ = pTVar2;
  local_a8.size_ = (size_t)local_a8.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList
            ((TestObjectList *)&stack0xffffffffffffff38,(IntrusiveListTest *)&local_a8,
             data_values_01);
  operator_delete(pTVar2);
  lVar5 = -2;
  pTVar2 = pTVar3;
  do {
    if (pTVar2 == (TestObject *)0x0) goto LAB_001eb055;
    pTVar2 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&local_88,(int)&local_88,(__off64_t *)0x0,(int)&stack0xffffffffffffff38,
             (__off64_t *)&stack0xffffffffffffff38,(size_t)pTVar2,(uint)pTVar3);
  local_a8.size_ = 0;
  local_a8.first_ = (TestObject *)0x0;
  local_a8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(0x14);
  local_a8.last_ = (TestObject *)&pTVar2->data2;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)0x100000064;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
       (TestObject *)0x300000002;
  pTVar2->data = 700;
  local_a8.first_ = pTVar2;
  local_a8.size_ = (size_t)local_a8.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&local_88,&local_a8,expected_01);
  operator_delete(pTVar2);
  local_a8.size_ = 0;
  local_a8.first_ = (TestObject *)0x0;
  local_a8.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(8);
  local_a8.last_ =
       (TestObject *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
  (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
       (TestObject *)&DAT_258000001f4;
  local_a8.first_ = pTVar2;
  local_a8.size_ = (size_t)local_a8.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&stack0xffffffffffffff38,&local_a8,expected_02);
  operator_delete(pTVar2);
  local_68.size_ = 0;
  local_68.first_ = (TestObject *)0x0;
  local_68.last_ = (TestObject *)0x0;
  pTVar2 = (TestObject *)operator_new(4);
  local_68.last_ =
       (TestObject *)
       ((long)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ + 4);
  *(undefined4 *)&(pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = 400
  ;
  local_68.first_ = pTVar2;
  local_68.size_ = (size_t)local_68.last_;
  anon_unknown.dwarf_7c624::IntrusiveListTest::NewList
            (&local_a8,(IntrusiveListTest *)&local_68,data_values_02);
  operator_delete(pTVar2);
  lVar5 = -3;
  pTVar2 = local_88.first_;
  while (pTVar2 != (TestObject *)0x0) {
    pTVar2 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    lVar5 = lVar5 + 1;
    if (lVar5 == 0) {
      wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
                (&local_88,(int)&local_88,(__off64_t *)pTVar2,(int)&local_a8,(__off64_t *)&local_a8,
                 (size_t)local_a8.first_,(uint)pTVar3);
      local_68.size_ = 0;
      local_68.first_ = (TestObject *)0x0;
      local_68.last_ = (TestObject *)0x0;
      pTVar2 = (TestObject *)operator_new(0x18);
      local_68.last_ = (TestObject *)&pTVar2->moved;
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
           (TestObject *)0x100000064;
      (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ =
           (TestObject *)0x19000000002;
      pTVar2->data = 3;
      pTVar2->data2 = 700;
      local_68.first_ = pTVar2;
      local_68.size_ = (size_t)local_68.last_;
      anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
                ((IntrusiveListTest *)&local_88,&local_68,expected_03);
      operator_delete(pTVar2);
      local_68.size_ = 0;
      local_68.first_ = (TestObject *)0x0;
      local_68.last_ = (TestObject *)0x0;
      anon_unknown.dwarf_7c624::IntrusiveListTest::AssertListEq
                ((IntrusiveListTest *)&local_a8,&local_68,expected_04);
      pTVar2 = local_a8.first_;
      while (pTVar2 != (TestObject *)0x0) {
        if (pTVar2->moved == false) {
          (anonymous_namespace)::TestObject::creation_count =
               (anonymous_namespace)::TestObject::creation_count + -1;
        }
        pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        operator_delete(pTVar2);
        pTVar2 = pTVar1;
      }
      while (pTVar2 = local_48.first_, pTVar3 != (TestObject *)0x0) {
        if (pTVar3->moved == false) {
          (anonymous_namespace)::TestObject::creation_count =
               (anonymous_namespace)::TestObject::creation_count + -1;
        }
        pTVar2 = (pTVar3->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        operator_delete(pTVar3);
        pTVar3 = pTVar2;
      }
      while (pTVar2 != (TestObject *)0x0) {
        if (pTVar2->moved == false) {
          (anonymous_namespace)::TestObject::creation_count =
               (anonymous_namespace)::TestObject::creation_count + -1;
        }
        pTVar3 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
        operator_delete(pTVar2);
        pTVar2 = pTVar3;
      }
      while (local_88.first_ != (TestObject *)0x0) {
        if ((local_88.first_)->moved == false) {
          (anonymous_namespace)::TestObject::creation_count =
               (anonymous_namespace)::TestObject::creation_count + -1;
        }
        pTVar2 = ((local_88.first_)->super_intrusive_list_base<(anonymous_namespace)::TestObject>).
                 next_;
        operator_delete(local_88.first_);
        local_88.first_ = pTVar2;
      }
      return;
    }
  }
LAB_001eb055:
  __assert_fail("node_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                ,0xa5,
                "iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::iterator::operator++() [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

TEST_F(IntrusiveListTest, splice_node) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200});
  list1.splice(list1.begin(), list2, list2.begin());
  AssertListEq(list1, {100, 1, 2, 3});
  AssertListEq(list2, {200});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin(), 2));
  AssertListEq(list1, {100, 1, 2, 3, 700});
  AssertListEq(list3, {500, 600});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 3), list4, list4.begin());
  AssertListEq(list1, {100, 1, 2, 400, 3, 700});
  AssertListEq(list4, {});
}